

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pic.cpp
# Opt level: O0

Point shrinkChunk(Image *chunk)

{
  Point PVar1;
  bool bVar2;
  Color *pCVar3;
  Color *pCVar4;
  int *in_RDI;
  Image *in_stack_00000010;
  Image *in_stack_00000018;
  Size in_stack_00000020;
  Point in_stack_00000028;
  Point in_stack_00000030;
  Image out;
  int y_1;
  int y;
  Point end;
  Point start;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  Size in_stack_ffffffffffffff40;
  Image *this;
  bool local_b1;
  Image *in_stack_ffffffffffffff60;
  Color in_stack_ffffffffffffff6c;
  Size in_stack_ffffffffffffff70;
  Image local_68;
  undefined4 local_44;
  undefined4 uStack_40;
  Point local_3c;
  Point local_34;
  int local_2c;
  int local_28;
  Point local_20;
  Point local_18;
  int *local_10;
  int local_8;
  int iStack_4;
  
  local_10 = in_RDI;
  memset(&local_18,0,8);
  local_20.x = *local_10;
  local_20.y = local_10[1];
  for (; local_18.y < local_20.y; local_18.y = local_18.y + 1) {
    pCVar3 = Image::pixel((Image *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                          in_stack_ffffffffffffff38);
    pCVar4 = Image::pixel((Image *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                          in_stack_ffffffffffffff38);
    bVar2 = std::any_of<Color*,shrinkChunk(Image&)::__0>(pCVar3,pCVar4);
    if (bVar2) break;
  }
  do {
    if (local_20.y + -1 <= local_18.y) {
LAB_001227cf:
      for (; local_18.x < local_20.x; local_18.x = local_18.x + 1) {
        for (local_28 = local_18.y; local_28 < local_20.y; local_28 = local_28 + 1) {
          pCVar3 = Image::pixel((Image *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                                in_stack_ffffffffffffff38);
          if (pCVar3->a != '\0') goto LAB_00122851;
        }
      }
LAB_00122851:
      do {
        if (local_20.x + -1 <= local_18.x) {
LAB_001228dc:
          local_34.x = 0;
          local_34.y = 0;
          bVar2 = Point::operator==(&local_18,&local_34);
          local_b1 = false;
          if (bVar2) {
            local_3c.x = *local_10;
            local_3c.y = local_10[1];
            local_b1 = Point::operator==(&local_20,&local_3c);
          }
          if (local_b1 == false) {
            if (local_18.y == local_20.y) {
              local_44 = 1;
              uStack_40 = 1;
              Image::fastResize((Image *)CONCAT44(in_stack_ffffffffffffff3c,
                                                  in_stack_ffffffffffffff38),
                                in_stack_ffffffffffffff40);
              local_8 = 0;
              iStack_4 = 0;
            }
            else {
              this = &local_68;
              Image::Image(in_stack_ffffffffffffff60,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff6c);
              Image::drawOnto(in_stack_00000018,in_stack_00000010,in_stack_00000030,
                              in_stack_00000028,in_stack_00000020);
              Image::operator=(this,(Image *)CONCAT44(in_stack_ffffffffffffff3c,
                                                      in_stack_ffffffffffffff38));
              local_8 = local_18.x;
              iStack_4 = local_18.y;
              Image::~Image((Image *)0x122aa0);
            }
          }
          else {
            local_8 = 0;
            iStack_4 = 0;
          }
          PVar1.y = iStack_4;
          PVar1.x = local_8;
          return PVar1;
        }
        for (local_2c = local_18.y; local_2c < local_20.y; local_2c = local_2c + 1) {
          pCVar3 = Image::pixel((Image *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                                in_stack_ffffffffffffff38);
          if (pCVar3->a != '\0') goto LAB_001228dc;
        }
        local_20.x = local_20.x + -1;
      } while( true );
    }
    pCVar3 = Image::pixel((Image *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                          in_stack_ffffffffffffff38);
    pCVar4 = Image::pixel((Image *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                          in_stack_ffffffffffffff38);
    bVar2 = std::any_of<Color*,shrinkChunk(Image&)::__1>(pCVar3,pCVar4);
    if (bVar2) goto LAB_001227cf;
    local_20.y = local_20.y + -1;
  } while( true );
}

Assistant:

Point shrinkChunk(Image& chunk) {
	Point start {0, 0};
	Point end {chunk.size.width, chunk.size.height};
	for (; start.y < end.y; start.y++) { // Shrink from top
		if (std::any_of(&chunk.pixel(start.x, start.y), &chunk.pixel(end.x, start.y), [](Color c){ return c.a > 0; })) {
			break;
		}
	}
	for (; start.y < end.y - 1; end.y--) { // Shrink from bottom
		if (std::any_of(&chunk.pixel(start.x, end.y - 1), &chunk.pixel(end.x, end.y - 1), [](Color c){ return c.a > 0; })) {
			break;
		}
	}
	for (; start.x < end.x; start.x++) { // Shrink from left
		for (int y = start.y; y < end.y; y++) {
			if (chunk.pixel(start.x, y).a > 0)
				goto leftfound;
		}
	}
leftfound:
	for(; start.x < end.x - 1; end.x--) { // Shrink from right
		for (int y = start.y; y < end.y; y++) {
			if (chunk.pixel(end.x - 1, y).a > 0)
				goto rightfound;
		}
	}
rightfound:
	if (start == Point{0, 0} && end == Point{chunk.size.width, chunk.size.height}) {
		// No resizing possible
		return {0, 0};
	} else if (start.y == end.y) {
		// TODO: Be able to remove empty chunks
		chunk.fastResize({1, 1});
		return {0, 0};
	} else {
		Image out({end.x - start.x, end.y - start.y});
		chunk.drawOnto(out, {0, 0}, {start.x, start.y}, out.size);
		chunk = std::move(out);
		return {start.x, start.y};
	}
}